

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

SetUpTearDownSuiteFuncType
testing::internal::SuiteApiResolver<(anonymous_namespace)::ktxTexture1_LoadImageDataTest>::
GetTearDownCaseOrSuite(char *filename,int line_num)

{
  bool bVar1;
  ostream *poVar2;
  int in_ESI;
  char *in_RDI;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  SetUpTearDownSuiteFuncType test_suite_fp;
  SetUpTearDownSuiteFuncType test_case_fp;
  SetUpTearDownSuiteFuncType local_68;
  byte local_35;
  GTestLog local_24;
  SetUpTearDownSuiteFuncType local_20;
  SetUpTearDownSuiteFuncType local_18;
  int local_c;
  char *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = GetNotDefaultOrNull(Test::TearDownTestCase,Test::TearDownTestCase);
  local_20 = GetNotDefaultOrNull(Test::TearDownTestSuite,Test::TearDownTestSuite);
  local_35 = 1;
  if (local_18 != (SetUpTearDownSuiteFuncType)0x0) {
    local_35 = local_20 != (SetUpTearDownSuiteFuncType)0x0 ^ 0xff;
  }
  bVar1 = IsTrue((bool)(local_35 & 1));
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
    poVar2 = GTestLog::GetStream(&local_24);
    poVar2 = std::operator<<(poVar2,"Condition !test_case_fp || !test_suite_fp failed. ");
    poVar2 = std::operator<<(poVar2,
                             "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                            );
    poVar2 = std::operator<<(poVar2,local_8);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,local_c);
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  if (local_18 == (SetUpTearDownSuiteFuncType)0x0) {
    local_68 = local_20;
  }
  else {
    local_68 = local_18;
  }
  return local_68;
}

Assistant:

static SetUpTearDownSuiteFuncType GetTearDownCaseOrSuite(const char* filename,
                                                           int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::TearDownTestCase, &Test::TearDownTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::TearDownTestSuite, &Test::TearDownTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both TearDownTestSuite and TearDownTestCase,"
           " please make sure there is only one present at"
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::TearDownTestSuite;
#endif
  }